

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O1

astcenc_error validate_block_size(uint block_x,uint block_y,uint block_z)

{
  bool bVar1;
  astcenc_error aVar2;
  
  if ((1 < block_z) || (bVar1 = is_legal_2d_block_size(block_x,block_y), !bVar1)) {
    if (block_z < 2) {
      return ASTCENC_ERR_BAD_BLOCK_SIZE;
    }
    bVar1 = is_legal_3d_block_size(block_x,block_y,block_z);
    if (!bVar1) {
      return ASTCENC_ERR_BAD_BLOCK_SIZE;
    }
  }
  aVar2 = ASTCENC_ERR_NOT_IMPLEMENTED;
  if (block_y * block_x * block_z < 0xd9) {
    aVar2 = ASTCENC_SUCCESS;
  }
  return aVar2;
}

Assistant:

static astcenc_error validate_block_size(
	unsigned int block_x,
	unsigned int block_y,
	unsigned int block_z
) {
	// Test if this is a legal block size at all
	bool is_legal = (((block_z <= 1) && is_legal_2d_block_size(block_x, block_y)) ||
	                 ((block_z >= 2) && is_legal_3d_block_size(block_x, block_y, block_z)));
	if (!is_legal)
	{
		return ASTCENC_ERR_BAD_BLOCK_SIZE;
	}

	// Test if this build has sufficient capacity for this block size
	bool have_capacity = (block_x * block_y * block_z) <= BLOCK_MAX_TEXELS;
	if (!have_capacity)
	{
		return ASTCENC_ERR_NOT_IMPLEMENTED;
	}

	return ASTCENC_SUCCESS;
}